

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O1

void __thiscall GrammarToken::set(GrammarToken *this,uint4 tp,char *ptr,int4 len)

{
  uint *puVar1;
  byte bVar2;
  string *psVar3;
  LowlevelError *this_00;
  intb val;
  string charstring;
  istringstream s;
  tokenvalue local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  string local_1a0 [3];
  ios_base local_128 [264];
  
  this->type = tp;
  if (tp - 0x105 < 2) {
    psVar3 = (string *)operator_new(0x20);
    (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar3,ptr,ptr + len);
    (this->value).stringval = psVar3;
    return;
  }
  if (tp != 0x104) {
    if (tp != 0x103) {
      this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
      local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Bad internal grammar token set","");
      LowlevelError::LowlevelError(this_00,local_1a0);
      __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    local_1c0[0] = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,ptr,ptr + len);
    std::__cxx11::istringstream::istringstream((istringstream *)local_1a0,(string *)local_1c0,_S_in)
    ;
    puVar1 = (uint *)((long)&local_1a0[0].field_2 +
                     *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18) + 8);
    *puVar1 = *puVar1 & 0xffffffb5;
    std::istream::_M_extract<long>((long *)local_1a0);
    this->value = local_1c8;
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
    std::ios_base::~ios_base(local_128);
    if (local_1c0[0] == local_1b0) {
      return;
    }
    operator_delete(local_1c0[0]);
    return;
  }
  if (len != 1) {
    bVar2 = ptr[1];
    if (bVar2 < 0x66) {
      if (bVar2 == 0x30) {
        (this->value).integer = 0;
        return;
      }
      if (bVar2 == 0x61) {
        (this->value).integer = 7;
        return;
      }
      if (bVar2 == 0x62) {
        (this->value).integer = 8;
        return;
      }
      goto switchD_0033a0f1_caseD_6f;
    }
    switch(bVar2) {
    case 0x6e:
      (this->value).integer = 10;
      break;
    case 0x72:
      (this->value).integer = 0xd;
      break;
    case 0x74:
      (this->value).integer = 9;
      break;
    case 0x76:
      (this->value).integer = 0xb;
      break;
    default:
      if (bVar2 == 0x66) {
        (this->value).integer = 0xc;
        return;
      }
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
switchD_0033a0f1_caseD_6f:
LAB_0033a0a6:
      this->value = (tokenvalue)(long)(char)bVar2;
    }
    return;
  }
  bVar2 = *ptr;
  goto LAB_0033a0a6;
}

Assistant:

void GrammarToken::set(uint4 tp,char *ptr,int4 len)

{
  type = tp;
  switch(tp) {
  case integer:
    {
      string charstring(ptr,len);
      istringstream s(charstring);
      s.unsetf(ios::dec | ios::hex | ios::oct);
      intb val;
      s >> val;
      value.integer = (uintb)val;
    }
    break;
  case identifier:
  case stringval:
    value.stringval = new string(ptr,len);
    break;
  case charconstant:
    if (len==1)
      value.integer = (uintb)*ptr;
    else {			// Backslash
      switch(ptr[1]) {
      case 'n':
	value.integer = 10;
	break;
      case '0':
	value.integer = 0;
	break;
      case 'a':
	value.integer = 7;
	break;
      case 'b':
	value.integer = 8;
	break;
      case 't':
	value.integer = 9;
	break;
      case 'v':
	value.integer = 11;
	break;
      case 'f':
	value.integer = 12;
	break;
      case 'r':
	value.integer = 13;
	break;
      default:
	value.integer = (uintb)ptr[1];
	break;
      }
    }
    break;
  default:
    throw LowlevelError("Bad internal grammar token set");
  }
}